

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::PoolingLayerParams::clear_PoolingPaddingType(PoolingLayerParams *this)

{
  uint32 uVar1;
  
  uVar1 = this->_oneof_case_[0];
  if ((((uVar1 == 0x20) || (uVar1 == 0x1f)) || (uVar1 == 0x1e)) &&
     ((this->PoolingPaddingType_).valid_ != (ValidPadding *)0x0)) {
    (*(((this->PoolingPaddingType_).valid_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void PoolingLayerParams::clear_PoolingPaddingType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.PoolingLayerParams)
  switch (PoolingPaddingType_case()) {
    case kValid: {
      delete PoolingPaddingType_.valid_;
      break;
    }
    case kSame: {
      delete PoolingPaddingType_.same_;
      break;
    }
    case kIncludeLastPixel: {
      delete PoolingPaddingType_.includelastpixel_;
      break;
    }
    case POOLINGPADDINGTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = POOLINGPADDINGTYPE_NOT_SET;
}